

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O3

void __thiscall cmExtraSublimeTextGenerator::Generate(cmExtraSublimeTextGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGlobalGenerator *pcVar2;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  string local_60;
  string local_40;
  
  pcVar2 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"CMAKE_SUBLIME_TEXT_2_EXCLUDE_BUILD_TREE","");
  bVar3 = cmGlobalGenerator::GlobalSettingIsOn(pcVar2,&local_60);
  this->ExcludeBuildFolder = bVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"CMAKE_SUBLIME_TEXT_2_ENV_SETTINGS","");
  cmGlobalGenerator::GetSafeGlobalSetting(&local_60,pcVar2,&local_40);
  std::__cxx11::string::operator=((string *)&this->EnvSettings,(string *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  for (p_Var4 = (pcVar2->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(pcVar2->ProjectMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    CreateProjectFile(this,(vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)
                           (p_Var4 + 2));
  }
  return;
}

Assistant:

void cmExtraSublimeTextGenerator::Generate()
{
  this->ExcludeBuildFolder = this->GlobalGenerator->GlobalSettingIsOn(
    "CMAKE_SUBLIME_TEXT_2_EXCLUDE_BUILD_TREE");
  this->EnvSettings = this->GlobalGenerator->GetSafeGlobalSetting(
    "CMAKE_SUBLIME_TEXT_2_ENV_SETTINGS");

  // for each sub project in the project create a sublime text 2 project
  for (auto const& it : this->GlobalGenerator->GetProjectMap()) {
    // create a project file
    this->CreateProjectFile(it.second);
  }
}